

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSEnumToUnicode
               (UConverterMBCSTable *mbcsTable,UConverterEnumToUCallback *callback,void *context,
               UErrorCode *pErrorCode)

{
  int local_ac;
  int8_t local_a8 [4];
  int32_t state;
  int8_t stateProps [128];
  UErrorCode *pErrorCode_local;
  void *context_local;
  UConverterEnumToUCallback *callback_local;
  UConverterMBCSTable *mbcsTable_local;
  
  stateProps._120_8_ = pErrorCode;
  memset(local_a8,0xff,0x80);
  getStateProp(mbcsTable->stateTable,local_a8,0);
  for (local_ac = 0; local_ac < (int)(uint)mbcsTable->countStates; local_ac = local_ac + 1) {
    if ('?' < local_a8[local_ac]) {
      enumToU(mbcsTable,local_a8,local_ac,0,0,callback,context,(UErrorCode *)stateProps._120_8_);
    }
  }
  return;
}

Assistant:

static void
ucnv_MBCSEnumToUnicode(UConverterMBCSTable *mbcsTable,
                       UConverterEnumToUCallback *callback, const void *context,
                       UErrorCode *pErrorCode) {
    /*
     * Properties for each state, to speed up the enumeration.
     * Ignorable actions are unassigned/illegal/state-change-only:
     * They do not lead to mappings.
     *
     * Bits 7..6:
     * 1 direct/initial state (stateful converters have multiple)
     * 0 non-initial state with transitions or with non-ignorable result actions
     * -1 final state with only ignorable actions
     *
     * Bits 5..3:
     * The lowest byte value with non-ignorable actions is
     * value<<5 (rounded down).
     *
     * Bits 2..0:
     * The highest byte value with non-ignorable actions is
     * (value<<5)&0x1f (rounded up).
     */
    int8_t stateProps[MBCS_MAX_STATE_COUNT];
    int32_t state;

    uprv_memset(stateProps, -1, sizeof(stateProps));

    /* recurse from state 0 and set all stateProps */
    getStateProp(mbcsTable->stateTable, stateProps, 0);

    for(state=0; state<mbcsTable->countStates; ++state) {
        /*if(stateProps[state]==-1) {
            printf("unused/unreachable <icu:state> %d\n", state);
        }*/
        if(stateProps[state]>=0x40) {
            /* start from each direct state */
            enumToU(
                mbcsTable, stateProps, state, 0, 0,
                callback, context,
                pErrorCode);
        }
    }
}